

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# if2ip.c
# Opt level: O0

if2ip_result_t Curl_if2ip(int af,uint remote_scope,uint param_3,char *interf,char *buf,int buf_size)

{
  int __fd;
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  char *r;
  size_t len;
  curl_socket_t dummy;
  sockaddr_in *s;
  undefined1 local_58 [4];
  in_addr in;
  ifreq req;
  int buf_size_local;
  char *buf_local;
  char *interf_local;
  uint local_scope_id_local;
  uint remote_scope_local;
  int af_local;
  
  if ((interf == (char *)0x0) || (af != 2)) {
    remote_scope_local = 0;
  }
  else {
    sVar2 = strlen(interf);
    if (sVar2 < 0x10) {
      __fd = socket(2,1,0);
      if (__fd == -1) {
        remote_scope_local = 0;
      }
      else {
        memset(local_58,0,0x28);
        memcpy(local_58,interf,sVar2 + 1);
        iVar1 = ioctl(__fd,0x8915,local_58);
        if (iVar1 < 0) {
          close(__fd);
          remote_scope_local = 0;
        }
        else {
          pcVar3 = inet_ntop(2,(void *)((long)&s + 4),buf,buf_size);
          close(__fd);
          if (pcVar3 == (char *)0x0) {
            remote_scope_local = 0;
          }
          else {
            remote_scope_local = 2;
          }
        }
      }
    }
    else {
      remote_scope_local = 0;
    }
  }
  return remote_scope_local;
}

Assistant:

if2ip_result_t Curl_if2ip(int af,
#ifdef ENABLE_IPV6
                          unsigned int remote_scope,
                          unsigned int local_scope_id,
#endif
                          const char *interf,
                          char *buf, int buf_size)
{
  struct ifreq req;
  struct in_addr in;
  struct sockaddr_in *s;
  curl_socket_t dummy;
  size_t len;
  const char *r;

#ifdef ENABLE_IPV6
  (void)remote_scope;
  (void)local_scope_id;
#endif

  if(!interf || (af != AF_INET))
    return IF2IP_NOT_FOUND;

  len = strlen(interf);
  if(len >= sizeof(req.ifr_name))
    return IF2IP_NOT_FOUND;

  dummy = socket(AF_INET, SOCK_STREAM, 0);
  if(CURL_SOCKET_BAD == dummy)
    return IF2IP_NOT_FOUND;

  memset(&req, 0, sizeof(req));
  memcpy(req.ifr_name, interf, len + 1);
  req.ifr_addr.sa_family = AF_INET;

  if(ioctl(dummy, SIOCGIFADDR, &req) < 0) {
    sclose(dummy);
    /* With SIOCGIFADDR, we cannot tell the difference between an interface
       that does not exist and an interface that has no address of the
       correct family. Assume the interface does not exist */
    return IF2IP_NOT_FOUND;
  }

  s = (struct sockaddr_in *)(void *)&req.ifr_addr;
  memcpy(&in, &s->sin_addr, sizeof(in));
  r = Curl_inet_ntop(s->sin_family, &in, buf, buf_size);

  sclose(dummy);
  if(!r)
    return IF2IP_NOT_FOUND;
  return IF2IP_FOUND;
}